

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O1

void __thiscall PSVIWriterHandlers::startDocument(PSVIWriterHandlers *this)

{
  startDocument((PSVIWriterHandlers *)&this[-1].fNSAttributes);
  return;
}

Assistant:

void PSVIWriterHandlers::startDocument() {
	fAttrList->removeAllElements();
	fAttrList->addElement((XMLCh*)gXmlnsColonXsi);
	fAttrList->addElement((XMLCh*)PSVIUni::fgNamespaceInstance);
	fAttrList->addElement((XMLCh*)gXmlnsColonPsv);
	fAttrList->addElement((XMLCh*)PSVIUni::fgNamespacePsvi);
	fAttrList->addElement((XMLCh*)XMLUni::fgXMLNSString);
	fAttrList->addElement((XMLCh*)PSVIUni::fgNamespaceInfoset);

	writeOpen(PSVIUni::fgDocument, fAttrList);
	incIndent();
	fElementChildren->push(false);
}